

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::DoPreConfigureChecks(cmake *this)

{
  cmState *pcVar1;
  bool bVar2;
  string *psVar3;
  cmValue cVar4;
  ostream *poVar5;
  int iVar6;
  char *pcVar7;
  string currentStart;
  cmAlphaNum local_220;
  string message;
  string cacheStart;
  string srcList;
  ostringstream err;
  
  psVar3 = GetHomeDirectory_abi_cxx11_(this);
  _err = (pointer)psVar3->_M_string_length;
  local_220.View_._M_len = 0xf;
  local_220.View_._M_str = "/CMakeLists.txt";
  cmStrCat<>(&srcList,(cmAlphaNum *)&err,&local_220);
  bVar2 = cmsys::SystemTools::FileExists(&srcList);
  if (bVar2) {
    pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"CMAKE_HOME_DIRECTORY",(allocator<char> *)&local_220);
    cVar4 = cmState::GetInitializedCacheValue(pcVar1,(string *)&err);
    std::__cxx11::string::~string((string *)&err);
    if (cVar4.Value == (string *)0x0) {
      iVar6 = 0;
    }
    else {
      pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&currentStart,"CMAKE_HOME_DIRECTORY",(allocator<char> *)&message);
      psVar3 = (string *)cmState::GetInitializedCacheValue(pcVar1,&currentStart);
      if (psVar3 == (string *)0x0) {
        psVar3 = &cmValue::Empty_abi_cxx11_;
      }
      _err = (pointer)psVar3->_M_string_length;
      local_220.View_._M_len = 0xf;
      local_220.View_._M_str = "/CMakeLists.txt";
      cmStrCat<>(&cacheStart,(cmAlphaNum *)&err,&local_220);
      std::__cxx11::string::~string((string *)&currentStart);
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      _err = (pointer)psVar3->_M_string_length;
      local_220.View_._M_len = 0xf;
      local_220.View_._M_str = "/CMakeLists.txt";
      cmStrCat<>(&currentStart,(cmAlphaNum *)&err,&local_220);
      bVar2 = cmsys::SystemTools::SameFile(&cacheStart,&currentStart);
      if (bVar2) {
        iVar6 = 1;
      }
      else {
        _err = (pointer)0xc;
        local_220.View_._M_len = currentStart._M_string_length;
        local_220.View_._M_str = currentStart._M_dataplus._M_p;
        cmStrCat<char[30],std::__cxx11::string,char[75]>
                  (&message,(cmAlphaNum *)&err,&local_220,
                   (char (*) [30])"\" does not match the source \"",&cacheStart,
                   (char (*) [75])
                   "\" used to generate cache.  Re-run cmake with a different source directory.");
        cmSystemTools::Error(&message);
        std::__cxx11::string::~string((string *)&message);
        iVar6 = -2;
      }
      std::__cxx11::string::~string((string *)&currentStart);
      std::__cxx11::string::~string((string *)&cacheStart);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&err);
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    bVar2 = cmsys::SystemTools::FileIsDirectory(psVar3);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&err,"The source directory \"");
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      poVar5 = std::operator<<(poVar5,(string *)psVar3);
      pcVar7 = "\" does not appear to contain CMakeLists.txt.\n";
    }
    else {
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      bVar2 = cmsys::SystemTools::FileExists(psVar3);
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&err,"The source directory \"");
        psVar3 = GetHomeDirectory_abi_cxx11_(this);
        poVar5 = std::operator<<(poVar5,(string *)psVar3);
        pcVar7 = "\" is a file, not a directory.\n";
      }
      else {
        poVar5 = std::operator<<((ostream *)&err,"The source directory \"");
        psVar3 = GetHomeDirectory_abi_cxx11_(this);
        poVar5 = std::operator<<(poVar5,(string *)psVar3);
        pcVar7 = "\" does not exist.\n";
      }
    }
    std::operator<<(poVar5,pcVar7);
    std::operator<<((ostream *)&err,
                    "Specify --help for usage, or press the help button on the CMake GUI.");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err);
    iVar6 = -2;
  }
  std::__cxx11::string::~string((string *)&srcList);
  return iVar6;
}

Assistant:

int cmake::DoPreConfigureChecks()
{
  // Make sure the Source directory contains a CMakeLists.txt file.
  std::string srcList = cmStrCat(this->GetHomeDirectory(), "/CMakeLists.txt");
  if (!cmSystemTools::FileExists(srcList)) {
    std::ostringstream err;
    if (cmSystemTools::FileIsDirectory(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not appear to contain CMakeLists.txt.\n";
    } else if (cmSystemTools::FileExists(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" is a file, not a directory.\n";
    } else {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not exist.\n";
    }
    err << "Specify --help for usage, or press the help button on the CMake "
           "GUI.";
    cmSystemTools::Error(err.str());
    return -2;
  }

  // do a sanity check on some values
  if (this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY")) {
    std::string cacheStart =
      cmStrCat(*this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY"),
               "/CMakeLists.txt");
    std::string currentStart =
      cmStrCat(this->GetHomeDirectory(), "/CMakeLists.txt");
    if (!cmSystemTools::SameFile(cacheStart, currentStart)) {
      std::string message =
        cmStrCat("The source \"", currentStart,
                 "\" does not match the source \"", cacheStart,
                 "\" used to generate cache.  Re-run cmake with a different "
                 "source directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    return 0;
  }
  return 1;
}